

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colourspaces.c
# Opt level: O0

khr_df_primaries_e findMapping(Primaries *p,float latitude)

{
  uint i;
  float latitude_local;
  Primaries *p_local;
  
  i = 0;
  while( true ) {
    if (10 < i) {
      return KHR_DF_PRIMARIES_UNSPECIFIED;
    }
    if (((((primaryMap[i].primaries.Rx - p->Rx <= latitude) &&
          (p->Rx - primaryMap[i].primaries.Rx <= latitude)) &&
         (primaryMap[i].primaries.Gx - p->Gx <= latitude)) &&
        ((p->Gx - primaryMap[i].primaries.Gx <= latitude &&
         (primaryMap[i].primaries.Bx - p->Bx <= latitude)))) &&
       ((p->Bx - primaryMap[i].primaries.Bx <= latitude &&
        ((primaryMap[i].primaries.Wx - p->Wx <= latitude &&
         (p->Wx - primaryMap[i].primaries.Wx <= latitude)))))) break;
    i = i + 1;
  }
  return primaryMap[i].dfPrimaryEnum;
}

Assistant:

khr_df_primaries_e findMapping(const Primaries *p, float latitude) {
    unsigned int i;
    for (i = 0; i < sizeof(primaryMap)/sizeof(sPrimaryMapping); ++i) {
        if (primaryMap[i].primaries.Rx - p->Rx <= latitude && p->Rx - primaryMap[i].primaries.Rx <= latitude &&
            primaryMap[i].primaries.Gx - p->Gx <= latitude && p->Gx - primaryMap[i].primaries.Gx <= latitude &&
            primaryMap[i].primaries.Bx - p->Bx <= latitude && p->Bx - primaryMap[i].primaries.Bx <= latitude &&
            primaryMap[i].primaries.Wx - p->Wx <= latitude && p->Wx - primaryMap[i].primaries.Wx <= latitude) {
            return primaryMap[i].dfPrimaryEnum;
        }
    }
    /* No match */
    return KHR_DF_PRIMARIES_UNSPECIFIED;
}